

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O0

void set_up_anim(Am_Object *line,int val)

{
  Am_Slot_Key AVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  Am_Value *pAVar6;
  Am_Wrapper *pAVar7;
  byte local_61;
  int new_top;
  int new_left;
  Am_String local_40;
  Am_String s;
  Am_Object anim;
  Am_Object local_20;
  int local_14;
  Am_Object *pAStack_10;
  int val_local;
  Am_Object *line_local;
  
  local_14 = val;
  pAStack_10 = line;
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)line);
  bVar2 = Am_Object::Valid();
  local_61 = 1;
  if ((bVar2 & 1) != 0) {
    pAVar6 = (Am_Value *)Am_Object::Get((ushort)pAStack_10,0x69);
    bVar3 = Am_Value::operator_cast_to_bool(pAVar6);
    local_61 = bVar3 ^ 0xff;
  }
  Am_Object::~Am_Object(&local_20);
  if ((local_61 & 1) == 0) {
    Am_Object::Create((char *)&s);
    Am_String::Am_String(&local_40);
    if (local_14 == 0) {
      Am_String::operator=(&local_40,"0");
    }
    else if (local_14 == 1) {
      Am_String::operator=(&local_40,"1");
    }
    else {
      Am_String::operator=(&local_40,"?");
    }
    pAVar6 = (Am_Value *)Am_Object::Get((ushort)pAStack_10,0x8b);
    uVar4 = Am_Value::operator_cast_to_int(pAVar6);
    Am_Object::Set((ushort)&s,100,(ulong)uVar4);
    pAVar6 = (Am_Value *)Am_Object::Get((ushort)pAStack_10,0x8c);
    iVar5 = Am_Value::operator_cast_to_int(pAVar6);
    Am_Object::Set((ushort)&s,0x65,(ulong)(iVar5 - 10));
    Am_Object::Set((ushort)&s,(Am_String *)0xab,(ulong)&local_40);
    AVar1 = INPUT_1;
    pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(pAStack_10);
    Am_Object::Add((ushort)&s,(Am_Wrapper *)(ulong)AVar1,(ulong)pAVar7);
    Am_Object::Am_Object((Am_Object *)&new_top,(Am_Object *)&s);
    Am_Object::Add_Part((Am_Object *)&scroller,SUB81(&new_top,0),1);
    Am_Object::~Am_Object((Am_Object *)&new_top);
    pAVar6 = (Am_Value *)Am_Object::Get((ushort)pAStack_10,0x8d);
    uVar4 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = (Am_Value *)Am_Object::Get((ushort)pAStack_10,0x8e);
    iVar5 = Am_Value::operator_cast_to_int(pAVar6);
    Am_Object::Set((ushort)&s,100,(ulong)uVar4);
    Am_Object::Set((ushort)&s,0x65,(ulong)(iVar5 - 10));
    Am_String::~Am_String(&local_40);
    Am_Object::~Am_Object((Am_Object *)&s);
  }
  return;
}

Assistant:

void set_up_anim(Am_Object &line, int val) {
  if (!line.Get_Owner().Valid() || !(bool)line.Get(Am_VISIBLE)) return;
  Am_Object anim = animation_proto.Create();
  Am_String s;
  if (val == 0) s = "0";
  else if (val == 1) s = "1";
  else s = "?";
  anim.Set(Am_LEFT, (int)line.Get(Am_X1), Am_NO_ANIMATION);
  anim.Set(Am_TOP, (int)line.Get(Am_Y1)-10, Am_NO_ANIMATION);
  anim.Set(Am_TEXT, s);
  anim.Add(INPUT_1, line);
  scroller.Add_Part(anim); //add to scroller so not selectable

  int new_left = (int)line.Get(Am_X2);
  int new_top = (int)line.Get(Am_Y2)-10;
  anim.Set(Am_LEFT, new_left);
  anim.Set(Am_TOP, new_top);
}